

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOT<double>::ThreadData::ThreadData
          (ThreadData *this,TPZStructMatrix *strmat,int seqnum,TPZBaseMatrix *mat,TPZBaseMatrix *rhs
          ,set<int,_std::less<int>,_std::allocator<int>_> *MaterialIds,
          TPZAutoPointer<TPZGuiInterface> *guiInterface,atomic<long> *currentIndex,bool computeRhs)

{
  TPZReference *in_RCX;
  undefined4 in_EDX;
  TPZReference *in_RSI;
  TPZAutoPointer<TPZGuiInterface> *in_RDI;
  TPZReference *in_R8;
  undefined7 in_stack_00000010;
  
  in_RDI->fRef = in_RSI;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(in_RDI,(TPZAutoPointer<TPZGuiInterface> *)in_RSI);
  in_RDI[2].fRef = in_RCX;
  in_RDI[3].fRef = in_R8;
  *(undefined4 *)&in_RDI[5].fRef = in_EDX;
  std::mutex::mutex((mutex *)0x1d84662);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xc));
  *(byte *)&in_RDI[0x16].fRef = (byte)MaterialIds & 1;
  in_RDI[4].fRef = (TPZReference *)CONCAT17(computeRhs,in_stack_00000010);
  return;
}

Assistant:

TPZStructMatrixOT<TVar>::ThreadData::ThreadData(
    TPZStructMatrix *strmat, int seqnum, TPZBaseMatrix &mat,
    TPZBaseMatrix &rhs,const std::set<int> &MaterialIds,
    TPZAutoPointer<TPZGuiInterface> guiInterface,
    std::atomic<int64_t> *currentIndex, bool computeRhs)
: fStruct(strmat), fGuiInterface(guiInterface), fGlobMatrix(&mat),
  fGlobRhs(&rhs), fThreadSeqNum(seqnum), fComputeRhs(computeRhs)
{
    fCurrentIndex = currentIndex;
    
    /*	sem_t *sem_open( ... );
     int sem_close(sem_t *sem);
     int sem_unlink(const char *name);
     */
    /*
     #ifdef MACOSX
     std::stringstream sout;
     static int counter = 0;
     sout << "AssemblySem" << counter++;
     fAssembly = sem_open(sout.str().c_str(), O_CREAT,777,1);
     if(fAssembly == SEM_FAILED)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     DebugStop();
     }
     #else
     int sem_result = sem_init(&fAssembly,0,0);
     if(sem_result != 0)
     {
     std::cout << __PRETTY_FUNCTION__ << " could not open the semaphore\n";
     }
     #endif
     */
}